

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateLibraryIncludes
          (FileGenerator *this,Printer *printer)

{
  Options *options;
  bool bVar1;
  LogMessage *pLVar2;
  int local_9c;
  LogMessage local_98;
  Formatter format;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  options = &this->options_;
  bVar1 = UsingImplicitWeakFields(this->file_,options);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/implicit_weak_message.h",
               (allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = HasWeakFields(this->file_,options);
  if (bVar1) {
    if ((this->options_).opensource_runtime == true) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,0x478);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: !options_.opensource_runtime: ");
      internal::LogFinisher::operator=((LogFinisher *)&local_9c,pLVar2);
      internal::LogMessage::~LogMessage(&local_98);
    }
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/weak_field_map.h",(allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = HasLazyFields(this->file_,options,&this->scc_analyzer_);
  if (bVar1) {
    if ((this->options_).opensource_runtime == true) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,0x47c);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: !options_.opensource_runtime: ");
      internal::LogFinisher::operator=((LogFinisher *)&local_9c,pLVar2);
      internal::LogMessage::~LogMessage(&local_98);
    }
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/lazy_field.h",(allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = ShouldVerify(this->file_,options,&this->scc_analyzer_);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/wire_format_verify.h",(allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((this->options_).opensource_runtime == true) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/port_def.inc",(allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
    local_98.level_ = 0x2e10f8;
    local_9c = 0x2e10f8;
    Formatter::operator()
              (&format,
               "#if PROTOBUF_VERSION < $1$\n#error This file was generated by a newer version of protoc which is\n#error incompatible with your Protocol Buffer headers. Please update\n#error your headers.\n#endif\n#if $2$ < PROTOBUF_MIN_PROTOC_VERSION\n#error This file was generated by an older version of protoc which is\n#error incompatible with your Protocol Buffer headers. Please\n#error regenerate this file with a newer version of protoc.\n#endif\n\n"
               ,(int *)&local_98,&local_9c);
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/port_undef.inc",(allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::string
            ((string *)&local_98,"net/proto2/io/public/coded_stream.h",(allocator *)&local_9c);
  IncludeFile(this,(string *)&local_98,printer);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string
            ((string *)&local_98,"net/proto2/public/arena.h",(allocator *)&local_9c);
  IncludeFile(this,(string *)&local_98,printer);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string
            ((string *)&local_98,"net/proto2/public/arenastring.h",(allocator *)&local_9c);
  IncludeFile(this,(string *)&local_98,printer);
  std::__cxx11::string::~string((string *)&local_98);
  if ((((this->options_).force_inline_string != false) ||
      ((this->options_).profile_driven_inline_string == true)) &&
     ((this->options_).opensource_runtime == false)) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/inlined_string_field.h",(allocator *)&local_9c
              );
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = HasSimpleBaseClasses(this->file_,options);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/generated_message_bases.h",
               (allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::string
            ((string *)&local_98,"net/proto2/public/generated_message_table_driven.h",
             (allocator *)&local_9c);
  IncludeFile(this,(string *)&local_98,printer);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = HasGeneratedMethods(this->file_,options);
  if (bVar1 && (this->options_).tctable_mode != kTCTableNever) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/generated_message_tctable_decl.h",
               (allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::string
            ((string *)&local_98,"net/proto2/public/generated_message_util.h",(allocator *)&local_9c
            );
  IncludeFile(this,(string *)&local_98,printer);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string
            ((string *)&local_98,"net/proto2/public/metadata_lite.h",(allocator *)&local_9c);
  IncludeFile(this,(string *)&local_98,printer);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = HasDescriptorMethods(this->file_,options);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/generated_message_reflection.h",
               (allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = HasDescriptorMethods(this->file_,options);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/message.h",(allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/message_lite.h",(allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
    }
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((this->options_).opensource_runtime == true) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/repeated_field.h",(allocator *)&local_9c);
    IncludeFileAndExport(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/extension_set.h",(allocator *)&local_9c);
    IncludeFileAndExport(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    bVar1 = HasExtensionsOrExtendableMessage(this->file_);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/extension_set.h",(allocator *)&local_9c);
      IncludeFileAndExport(this,(string *)&local_98,printer);
      std::__cxx11::string::~string((string *)&local_98);
    }
    bVar1 = HasRepeatedFields(this->file_);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/repeated_field.h",(allocator *)&local_9c);
      IncludeFileAndExport(this,(string *)&local_98,printer);
      std::__cxx11::string::~string((string *)&local_98);
    }
    bVar1 = HasStringPieceFields(this->file_,options);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/string_piece_field_support.h",
                 (allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
      std::__cxx11::string::~string((string *)&local_98);
    }
    bVar1 = HasCordFields(this->file_,options);
    if (bVar1) {
      Formatter::operator()<>(&format,"#include \"third_party/absl/strings/cord.h\"\n");
    }
  }
  bVar1 = HasMapFields(this->file_);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/map.h",(allocator *)&local_9c);
    IncludeFileAndExport(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
    bVar1 = HasDescriptorMethods(this->file_,options);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/map_entry.h",(allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/map_field_inl.h",(allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/map_entry_lite.h",(allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/map_field_lite.h",(allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
    }
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = HasEnumDefinitions(this->file_);
  if (bVar1) {
    bVar1 = HasDescriptorMethods(this->file_,options);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/generated_enum_reflection.h",
                 (allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_98,"net/proto2/public/generated_enum_util.h",
                 (allocator *)&local_9c);
      IncludeFile(this,(string *)&local_98,printer);
    }
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = HasGenericServices(this->file_,options);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/service.h",(allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = UseUnknownFieldSet(this->file_,options);
  if ((bVar1) &&
     ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::string
              ((string *)&local_98,"net/proto2/public/unknown_field_set.h",(allocator *)&local_9c);
    IncludeFile(this,(string *)&local_98,printer);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateLibraryIncludes(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (UsingImplicitWeakFields(file_, options_)) {
    IncludeFile("net/proto2/public/implicit_weak_message.h", printer);
  }
  if (HasWeakFields(file_, options_)) {
    GOOGLE_CHECK(!options_.opensource_runtime);
    IncludeFile("net/proto2/public/weak_field_map.h", printer);
  }
  if (HasLazyFields(file_, options_, &scc_analyzer_)) {
    GOOGLE_CHECK(!options_.opensource_runtime);
    IncludeFile("net/proto2/public/lazy_field.h", printer);
  }
  if (ShouldVerify(file_, options_, &scc_analyzer_)) {
    IncludeFile("net/proto2/public/wire_format_verify.h", printer);
  }

  if (options_.opensource_runtime) {
    // Verify the protobuf library header version is compatible with the protoc
    // version before going any further.
    IncludeFile("net/proto2/public/port_def.inc", printer);
    format(
        "#if PROTOBUF_VERSION < $1$\n"
        "#error This file was generated by a newer version of protoc which is\n"
        "#error incompatible with your Protocol Buffer headers. Please update\n"
        "#error your headers.\n"
        "#endif\n"
        "#if $2$ < PROTOBUF_MIN_PROTOC_VERSION\n"
        "#error This file was generated by an older version of protoc which "
        "is\n"
        "#error incompatible with your Protocol Buffer headers. Please\n"
        "#error regenerate this file with a newer version of protoc.\n"
        "#endif\n"
        "\n",
        PROTOBUF_MIN_HEADER_VERSION_FOR_PROTOC,  // 1
        PROTOBUF_VERSION);                       // 2
    IncludeFile("net/proto2/public/port_undef.inc", printer);
  }

  // OK, it's now safe to #include other files.
  IncludeFile("net/proto2/io/public/coded_stream.h", printer);
  IncludeFile("net/proto2/public/arena.h", printer);
  IncludeFile("net/proto2/public/arenastring.h", printer);
  if ((options_.force_inline_string || options_.profile_driven_inline_string) &&
      !options_.opensource_runtime) {
    IncludeFile("net/proto2/public/inlined_string_field.h", printer);
  }
  if (HasSimpleBaseClasses(file_, options_)) {
    IncludeFile("net/proto2/public/generated_message_bases.h", printer);
  }
  IncludeFile("net/proto2/public/generated_message_table_driven.h", printer);
  if (HasGeneratedMethods(file_, options_) &&
      options_.tctable_mode != Options::kTCTableNever) {
    IncludeFile("net/proto2/public/generated_message_tctable_decl.h", printer);
  }
  IncludeFile("net/proto2/public/generated_message_util.h", printer);
  IncludeFile("net/proto2/public/metadata_lite.h", printer);

  if (HasDescriptorMethods(file_, options_)) {
    IncludeFile("net/proto2/public/generated_message_reflection.h", printer);
  }

  if (!message_generators_.empty()) {
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/message.h", printer);
    } else {
      IncludeFile("net/proto2/public/message_lite.h", printer);
    }
  }
  if (options_.opensource_runtime) {
    // Open-source relies on unconditional includes of these.
    IncludeFileAndExport("net/proto2/public/repeated_field.h", printer);
    IncludeFileAndExport("net/proto2/public/extension_set.h", printer);
  } else {
    // Google3 includes these files only when they are necessary.
    if (HasExtensionsOrExtendableMessage(file_)) {
      IncludeFileAndExport("net/proto2/public/extension_set.h", printer);
    }
    if (HasRepeatedFields(file_)) {
      IncludeFileAndExport("net/proto2/public/repeated_field.h", printer);
    }
    if (HasStringPieceFields(file_, options_)) {
      IncludeFile("net/proto2/public/string_piece_field_support.h", printer);
    }
    if (HasCordFields(file_, options_)) {
      format("#include \"third_party/absl/strings/cord.h\"\n");
    }
  }
  if (HasMapFields(file_)) {
    IncludeFileAndExport("net/proto2/public/map.h", printer);
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/map_entry.h", printer);
      IncludeFile("net/proto2/public/map_field_inl.h", printer);
    } else {
      IncludeFile("net/proto2/public/map_entry_lite.h", printer);
      IncludeFile("net/proto2/public/map_field_lite.h", printer);
    }
  }

  if (HasEnumDefinitions(file_)) {
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/generated_enum_reflection.h", printer);
    } else {
      IncludeFile("net/proto2/public/generated_enum_util.h", printer);
    }
  }

  if (HasGenericServices(file_, options_)) {
    IncludeFile("net/proto2/public/service.h", printer);
  }

  if (UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    IncludeFile("net/proto2/public/unknown_field_set.h", printer);
  }
}